

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuThreadUtil.cpp
# Opt level: O1

void __thiscall tcu::ThreadUtil::Operation::Operation(Operation *this,char *name)

{
  Event *this_00;
  SharedPtrStateBase *pSVar1;
  
  this->_vptr_Operation = (_func_int **)&PTR__Operation_021c8cb8;
  this->m_name = name;
  (this->m_deps).
  super__Vector_base<de::SharedPtr<tcu::ThreadUtil::Event>,_std::allocator<de::SharedPtr<tcu::ThreadUtil::Event>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_deps).
  super__Vector_base<de::SharedPtr<tcu::ThreadUtil::Event>,_std::allocator<de::SharedPtr<tcu::ThreadUtil::Event>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_deps).
  super__Vector_base<de::SharedPtr<tcu::ThreadUtil::Event>,_std::allocator<de::SharedPtr<tcu::ThreadUtil::Event>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_00 = (Event *)operator_new(0x18);
  Event::Event(this_00);
  (this->m_event).m_ptr = (Event *)0x0;
  (this->m_event).m_state = (SharedPtrStateBase *)0x0;
  (this->m_event).m_ptr = this_00;
  pSVar1 = (SharedPtrStateBase *)operator_new(0x20);
  pSVar1->strongRefCount = 0;
  pSVar1->weakRefCount = 0;
  pSVar1->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_021c8dd8;
  pSVar1[1]._vptr_SharedPtrStateBase = (_func_int **)this_00;
  (this->m_event).m_state = pSVar1;
  pSVar1->strongRefCount = 1;
  pSVar1->weakRefCount = 1;
  return;
}

Assistant:

Operation::Operation (const char* name)
	: m_name	(name)
	, m_event	(new Event)
{
}